

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void __thiscall
SimpleAsciiFixture_IndexStdString_Test::~SimpleAsciiFixture_IndexStdString_Test
          (SimpleAsciiFixture_IndexStdString_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (SimpleAsciiFixture, IndexStdString) {
    std::string::const_iterator begin = std::begin (str);
    std::string::const_iterator end = std::end (str);
    auto it = begin;
    ASSERT_EQ (it, pstore::utf::index (begin, end, 0));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 1));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 2));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 3));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 4));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 5));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 6));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 7));
    std::advance (it, 1);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 8));

    ASSERT_EQ (end, pstore::utf::index (begin, end, 9));
    ASSERT_EQ (end, pstore::utf::index (begin, end, std::numeric_limits<std::size_t>::max ()));
}